

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Linker.cpp
# Opt level: O0

void __thiscall
nigel::Linker::printToFile
          (Linker *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *data,path *file)

{
  bool bVar1;
  uint uVar2;
  size_type sVar3;
  const_reference pvVar4;
  byte *pbVar5;
  ulong uVar6;
  long lVar7;
  string *psVar8;
  char *pcVar9;
  long local_4e8;
  ofstream filestream;
  string local_2e8;
  string local_2c8;
  string local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  string local_1c8;
  string local_1a8;
  string local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  string local_a8;
  ulong local_88;
  size_t i;
  undefined1 local_78 [4];
  u16 checksum;
  u16 startAddr;
  String out;
  allocator local_41;
  string local_40 [8];
  String fileStr;
  path *file_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *data_local;
  Linker *this_local;
  
  fileStr.field_2._8_8_ = file;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"",&local_41);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  std::__cxx11::string::string((string *)local_78);
  i._6_2_ = 0;
  i._4_2_ = 0;
  for (local_88 = 0; uVar6 = local_88,
      sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(data), uVar6 < sVar3;
      local_88 = local_88 + 1) {
    pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](data,local_88);
    helper::int_to_hex<unsigned_char>(&local_a8,*pvVar4);
    std::__cxx11::string::operator+=((string *)local_78,(string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](data,local_88);
    i._4_2_ = i._4_2_ + (ushort)*pbVar5;
    uVar6 = std::__cxx11::string::size();
    if (0x1f < uVar6) {
      uVar2 = std::__cxx11::string::size();
      i._4_2_ = i._4_2_ + (short)(uVar2 >> 1) + (i._6_2_ & 0xff) + (i._6_2_ >> 8);
      uVar2 = std::__cxx11::string::size();
      helper::int_to_hex<unsigned_char>(&local_188,(u8)(uVar2 >> 1));
      std::operator+(&local_168,":",&local_188);
      helper::int_to_hex<unsigned_short>(&local_1a8,i._6_2_);
      std::operator+(&local_148,&local_168,&local_1a8);
      std::operator+(&local_128,&local_148,"00");
      std::operator+(&local_108,&local_128,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78);
      helper::int_to_hex<unsigned_char>(&local_1c8,-i._4_1_);
      std::operator+(&local_e8,&local_108,&local_1c8);
      std::operator+(&local_c8,&local_e8,"\r\n");
      std::__cxx11::string::operator+=(local_40,(string *)&local_c8);
      std::__cxx11::string::~string((string *)&local_c8);
      std::__cxx11::string::~string((string *)&local_e8);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::__cxx11::string::~string((string *)&local_108);
      std::__cxx11::string::~string((string *)&local_128);
      std::__cxx11::string::~string((string *)&local_148);
      std::__cxx11::string::~string((string *)&local_1a8);
      std::__cxx11::string::~string((string *)&local_168);
      std::__cxx11::string::~string((string *)&local_188);
      i._4_2_ = 0;
      uVar2 = std::__cxx11::string::size();
      i._6_2_ = i._6_2_ + (short)(uVar2 >> 1);
      std::__cxx11::string::operator=((string *)local_78,"");
    }
  }
  lVar7 = std::__cxx11::string::size();
  if (lVar7 != 0) {
    uVar2 = std::__cxx11::string::size();
    i._4_2_ = i._4_2_ + (short)(uVar2 >> 1) + (i._6_2_ & 0xff) + (i._6_2_ >> 8);
    uVar2 = std::__cxx11::string::size();
    helper::int_to_hex<unsigned_char>(&local_2a8,(u8)(uVar2 >> 1));
    std::operator+(&local_288,":",&local_2a8);
    helper::int_to_hex<unsigned_short>(&local_2c8,i._6_2_);
    std::operator+(&local_268,&local_288,&local_2c8);
    std::operator+(&local_248,&local_268,"00");
    std::operator+(&local_228,&local_248,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78);
    helper::int_to_hex<unsigned_char>(&local_2e8,-i._4_1_);
    std::operator+(&local_208,&local_228,&local_2e8);
    std::operator+(&local_1e8,&local_208,"\r\n");
    std::__cxx11::string::operator+=(local_40,(string *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&local_2e8);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)&local_2c8);
    std::__cxx11::string::~string((string *)&local_288);
    std::__cxx11::string::~string((string *)&local_2a8);
  }
  std::__cxx11::string::operator+=(local_40,":00000001FF");
  psVar8 = boost::filesystem::path::string_abi_cxx11_(file);
  std::ofstream::ofstream(&local_4e8,(string *)psVar8,_S_bin);
  bVar1 = std::ios::operator_cast_to_bool((ios *)((long)&local_4e8 + *(long *)(local_4e8 + -0x18)));
  if (bVar1) {
    pcVar9 = (char *)std::__cxx11::string::c_str();
    std::operator<<((ostream *)&local_4e8,pcVar9);
    std::ofstream::close();
  }
  std::ofstream::~ofstream(&local_4e8);
  std::__cxx11::string::~string((string *)local_78);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void Linker::printToFile( const std::vector<u8>& data, fs::path file )
	{
		String fileStr = "";
		String out;
		u16 startAddr = 0;
		u16 checksum = 0;
		for( size_t i = 0 ; i < data.size() ; i++ )
		{
			out += int_to_hex( data[i] );
			checksum += data[i];

			if( out.size() >= 32 )
			{
				checksum += ( out.size() / 2 ) + ( startAddr & 0xff ) + ( startAddr >> 8 );
				fileStr += ":" + int_to_hex( static_cast< u8 >( out.size() / 2 ) ) + int_to_hex( startAddr ) + "00" + out + int_to_hex( static_cast< u8 >( ~( checksum % 256 )+1 ) ) + "\r\n";
				checksum = 0;
				startAddr += static_cast< u16 >( out.size() / 2 );
				out = "";
            }
		}
		if( out.size() > 0 )
		{
			checksum += ( out.size() / 2 ) + ( startAddr & 0xff ) + ( startAddr >> 8 );
			fileStr += ":" + int_to_hex( static_cast< u8 >( out.size() / 2 ) ) + int_to_hex( startAddr ) + "00" + out + int_to_hex( static_cast< u8 >( ~( checksum % 256 )+1 ) ) + "\r\n";
		}
		fileStr += ":00000001FF";


		std::ofstream filestream( file.string(), std::ios_base::binary );

		if( filestream )
		{
			filestream << fileStr.c_str();
			filestream.close();
		}
	}